

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O0

QString * QInputDialog::getItem
                    (QWidget *parent,QString *title,QString *label,QStringList *items,int current,
                    bool editable,bool *ok,WindowFlags flags,InputMethodHints inputMethodHints)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  QWidget *parent_00;
  QInputDialog *pQVar4;
  QList<QString> *in_RCX;
  QInputDialog *in_RDI;
  QWidget *in_R8;
  QFlagsStorage<Qt::InputMethodHint> in_R9D;
  long in_FS_OFFSET;
  undefined1 in_stack_00000008;
  long in_stack_00000010;
  int ret;
  QAutoPointer<QInputDialog> dialog;
  QString text;
  QInputDialog *items_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined3 in_stack_ffffffffffffff88;
  uint uVar5;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = CONCAT13(in_stack_00000008,in_stack_ffffffffffffff88) & 0x1ffffff;
  items_00 = in_RDI;
  QList<QString>::value(in_RCX,(qsizetype)in_R8);
  parent_00 = (QWidget *)operator_new(0x28);
  QInputDialog((QInputDialog *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               parent_00,(WindowFlags)in_R9D.i);
  QAutoPointer<QInputDialog>::QAutoPointer((QAutoPointer<QInputDialog> *)items_00,in_RDI);
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79e0e1);
  QWidget::setWindowTitle(in_R8,(QString *)CONCAT44(in_R9D.i,uVar5));
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79e0f8);
  setLabelText((QInputDialog *)in_R8,(QString *)CONCAT44(in_R9D.i,uVar5));
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79e10f);
  setComboBoxItems((QInputDialog *)parent_00,(QStringList *)items_00);
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79e126);
  setTextValue((QInputDialog *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               (QString *)parent_00);
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79e13d);
  setComboBoxEditable((QInputDialog *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                      SUB81((ulong)parent_00 >> 0x38,0));
  QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79e158);
  QWidget::setInputMethodHints(parent_00,(InputMethodHints)in_R9D.i);
  pQVar4 = QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79e179);
  iVar3 = (**(code **)(*(long *)&(pQVar4->super_QDialog).super_QWidget + 0x1a8))();
  if (in_stack_00000010 != 0) {
    *(bool *)in_stack_00000010 = iVar3 != 0;
  }
  bVar2 = QAutoPointer::operator_cast_to_bool((QAutoPointer<QInputDialog> *)0x79e1b9);
  if ((bVar2) && (iVar3 != 0)) {
    QAutoPointer<QInputDialog>::operator->((QAutoPointer<QInputDialog> *)0x79e1d0);
    textValue((QInputDialog *)parent_00);
  }
  else {
    QString::QString((QString *)items_00,(QString *)in_RDI);
  }
  QAutoPointer<QInputDialog>::~QAutoPointer((QAutoPointer<QInputDialog> *)items_00);
  QString::~QString((QString *)0x79e210);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QString *)items_00;
}

Assistant:

QString QInputDialog::getItem(QWidget *parent, const QString &title, const QString &label,
                              const QStringList &items, int current, bool editable, bool *ok,
                              Qt::WindowFlags flags, Qt::InputMethodHints inputMethodHints)
{
    QString text(items.value(current));

    QAutoPointer<QInputDialog> dialog(new QInputDialog(parent, flags));
    dialog->setWindowTitle(title);
    dialog->setLabelText(label);
    dialog->setComboBoxItems(items);
    dialog->setTextValue(text);
    dialog->setComboBoxEditable(editable);
    dialog->setInputMethodHints(inputMethodHints);

    const int ret = dialog->exec();
    if (ok)
        *ok = !!ret;
    if (bool(dialog) && ret) {
        return dialog->textValue();
    } else {
        return text;
    }
}